

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_bpf_process_pcm_frames
                    (ma_bpf *pBPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ma_bpf2 *pmVar15;
  ma_biquad_coefficient *pmVar16;
  ma_result mVar17;
  long lVar18;
  undefined2 uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  float *pFramesInF32;
  int iVar25;
  ulong uVar26;
  ma_int16 *pFramesOutS16;
  float fVar27;
  
  if (pBPF == (ma_bpf *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pFramesOut == pFramesIn) {
    if (pBPF->bpf2Count != 0) {
      lVar18 = 0;
      uVar26 = 0;
      do {
        if (pBPF->pBPF2 == (ma_bpf2 *)0x0) {
          mVar17 = MA_INVALID_ARGS;
        }
        else {
          mVar17 = ma_biquad_process_pcm_frames
                             ((ma_biquad *)((long)&(pBPF->pBPF2->bq).format + lVar18),pFramesOut,
                              pFramesOut,frameCount);
        }
        if (mVar17 != MA_SUCCESS) {
          return mVar17;
        }
        uVar26 = uVar26 + 1;
        lVar18 = lVar18 + 0x40;
      } while (uVar26 < pBPF->bpf2Count);
    }
    if (pFramesOut == pFramesIn) {
      return MA_SUCCESS;
    }
  }
  if (pBPF->format == ma_format_f32) {
    if (frameCount != 0) {
      uVar26 = 0;
      do {
        memcpy(pFramesOut,pFramesIn,(ulong)((&DAT_0019eb10)[pBPF->format] * pBPF->channels));
        if (pBPF->bpf2Count != 0) {
          uVar22 = 0;
          do {
            pmVar15 = pBPF->pBPF2;
            uVar8 = pmVar15[uVar22].bq.channels;
            fVar1 = pmVar15[uVar22].bq.b0.f32;
            fVar2 = pmVar15[uVar22].bq.b1.f32;
            fVar3 = pmVar15[uVar22].bq.b2.f32;
            fVar4 = pmVar15[uVar22].bq.a1.f32;
            fVar5 = pmVar15[uVar22].bq.a2.f32;
            uVar21 = 0;
            do {
              pmVar16 = pmVar15[uVar22].bq.pR1;
              fVar6 = *(float *)((long)pFramesOut + uVar21 * 4);
              fVar27 = fVar1 * fVar6 + pmVar16[uVar21].f32;
              fVar7 = pmVar15[uVar22].bq.pR2[uVar21].f32;
              *(float *)((long)pFramesOut + uVar21 * 4) = fVar27;
              pmVar16[uVar21].f32 = fVar2 * fVar6 + fVar27 * -fVar4 + fVar7;
              pmVar15[uVar22].bq.pR2[uVar21].f32 = fVar6 * fVar3 + fVar27 * -fVar5;
              uVar21 = uVar21 + 1;
            } while (uVar8 != uVar21);
            uVar22 = uVar22 + 1;
          } while (uVar22 < pBPF->bpf2Count);
        }
        pFramesOut = (void *)((long)pFramesOut + (ulong)pBPF->channels * 4);
        pFramesIn = (void *)((long)pFramesIn + (ulong)pBPF->channels * 4);
        uVar26 = (ulong)((int)uVar26 + 1);
      } while (uVar26 < frameCount);
    }
  }
  else {
    if (pBPF->format != ma_format_s16) {
      return MA_INVALID_OPERATION;
    }
    if (frameCount != 0) {
      uVar26 = 0;
      do {
        memcpy(pFramesOut,pFramesIn,(ulong)((&DAT_0019eb10)[pBPF->format] * pBPF->channels));
        if (pBPF->bpf2Count != 0) {
          uVar22 = 0;
          do {
            pmVar15 = pBPF->pBPF2;
            uVar8 = pmVar15[uVar22].bq.channels;
            iVar9 = pmVar15[uVar22].bq.b0.s32;
            iVar10 = pmVar15[uVar22].bq.b1.s32;
            iVar11 = pmVar15[uVar22].bq.b2.s32;
            iVar12 = pmVar15[uVar22].bq.a1.s32;
            iVar13 = pmVar15[uVar22].bq.a2.s32;
            uVar21 = 0;
            do {
              pmVar16 = pmVar15[uVar22].bq.pR1;
              iVar25 = (int)*(short *)((long)pFramesOut + uVar21 * 2);
              iVar14 = pmVar15[uVar22].bq.pR2[uVar21].s32;
              iVar20 = iVar9 * iVar25 + pmVar16[uVar21].s32 >> 0xe;
              iVar23 = iVar12 * iVar20;
              iVar24 = iVar20 * iVar13;
              if (0x7ffe < iVar20) {
                iVar20 = 0x7fff;
              }
              uVar19 = (undefined2)iVar20;
              if (iVar20 < -0x7fff) {
                uVar19 = 0x8000;
              }
              *(undefined2 *)((long)pFramesOut + uVar21 * 2) = uVar19;
              pmVar16[uVar21].s32 = (iVar10 * iVar25 + iVar14) - iVar23;
              pmVar15[uVar22].bq.pR2[uVar21].s32 = iVar25 * iVar11 - iVar24;
              uVar21 = uVar21 + 1;
            } while (uVar8 != uVar21);
            uVar22 = uVar22 + 1;
          } while (uVar22 < pBPF->bpf2Count);
        }
        pFramesOut = (void *)((long)pFramesOut + (ulong)pBPF->channels * 2);
        pFramesIn = (void *)((long)pFramesIn + (ulong)pBPF->channels * 2);
        uVar26 = (ulong)((int)uVar26 + 1);
      } while (uVar26 < frameCount);
    }
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_bpf_process_pcm_frames(ma_bpf* pBPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_result result;
    ma_uint32 ibpf2;

    if (pBPF == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Faster path for in-place. */
    if (pFramesOut == pFramesIn) {
        for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
            result = ma_bpf2_process_pcm_frames(&pBPF->pBPF2[ibpf2], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
    }

    /* Slightly slower path for copying. */
    if (pFramesOut != pFramesIn) {
        ma_uint32 iFrame;

        /*  */ if (pBPF->format == ma_format_f32) {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutF32, pFramesInF32, ma_get_bytes_per_frame(pBPF->format, pBPF->channels));

                for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
                    ma_bpf2_process_pcm_frame_f32(&pBPF->pBPF2[ibpf2], pFramesOutF32, pFramesOutF32);
                }

                pFramesOutF32 += pBPF->channels;
                pFramesInF32  += pBPF->channels;
            }
        } else if (pBPF->format == ma_format_s16) {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutS16, pFramesInS16, ma_get_bytes_per_frame(pBPF->format, pBPF->channels));

                for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
                    ma_bpf2_process_pcm_frame_s16(&pBPF->pBPF2[ibpf2], pFramesOutS16, pFramesOutS16);
                }

                pFramesOutS16 += pBPF->channels;
                pFramesInS16  += pBPF->channels;
            }
        } else {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Should never hit this. */
        }
    }

    return MA_SUCCESS;
}